

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall
rsg::VariableManager::setValue(VariableManager *this,Variable *variable,ConstValueRangeAccess value)

{
  iterator iVar1;
  bool bVar2;
  ValueScope *this_00;
  ValueEntry *pVVar3;
  reference ppVVar4;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_50;
  CompareEntryVariable local_48;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_40;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_38;
  __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
  local_30;
  iterator cachePos;
  ValueEntry *newEntry;
  ValueScope *curScope;
  Variable *variable_local;
  VariableManager *this_local;
  
  this_00 = getCurValueScope(this);
  pVVar3 = ValueScope::findEntry(this_00,variable);
  if (pVVar3 == (ValueEntry *)0x0) {
    cachePos._M_current = (ValueEntry **)ValueScope::allocate(this_00,variable);
    local_38._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::begin
                   (&this->m_entryCache);
    local_40._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                   (&this->m_entryCache);
    CompareEntryVariable::CompareEntryVariable(&local_48,variable);
    local_30 = std::
               find<__gnu_cxx::__normal_iterator<rsg::ValueEntry_const**,std::vector<rsg::ValueEntry_const*,std::allocator<rsg::ValueEntry_const*>>>,rsg::CompareEntryVariable>
                         (local_38,local_40,&local_48);
    local_50._M_current =
         (ValueEntry **)
         std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::end
                   (&this->m_entryCache);
    bVar2 = __gnu_cxx::operator!=(&local_30,&local_50);
    iVar1 = cachePos;
    if (bVar2) {
      ppVVar4 = __gnu_cxx::
                __normal_iterator<const_rsg::ValueEntry_**,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>
                ::operator*(&local_30);
      *ppVVar4 = (ValueEntry *)iVar1._M_current;
    }
    else {
      std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>::push_back
                (&this->m_entryCache,(value_type *)&cachePos);
    }
  }
  ValueScope::setValue(this_00,variable,value);
  return;
}

Assistant:

void VariableManager::setValue (const Variable* variable, ConstValueRangeAccess value)
{
	ValueScope& curScope = getCurValueScope();

	if (!curScope.findEntry(variable))
	{
		// New value, allocate and update cache.
		ValueEntry*									newEntry	= curScope.allocate(variable);
		std::vector<const ValueEntry*>::iterator	cachePos	= std::find(m_entryCache.begin(), m_entryCache.end(), CompareEntryVariable(variable));

		if (cachePos != m_entryCache.end())
			*cachePos = newEntry;
		else
			m_entryCache.push_back(newEntry);
	}

	curScope.setValue(variable, value);
}